

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::AdvanceArrayIndex_SnapArrayInfoCompare<void*>
               (uint32 *index,uint32 *pos,SnapArrayInfoBlock<void_*> **segment)

{
  SnapArrayInfoBlock<void_*> **segment_local;
  uint32 *pos_local;
  uint32 *index_local;
  
  *index = *index + 1;
  if (*index < (*segment)->LastIndex) {
    if (*index < (*segment)->FirstIndex) {
      TTDAbort_unrecoverable_error("Something went wrong.");
    }
    *pos = *index - (*segment)->FirstIndex;
  }
  else {
    *segment = (*segment)->Next;
    *pos = 0;
    if (*segment != (SnapArrayInfoBlock<void_*> *)0x0) {
      *index = (*segment)->FirstIndex;
    }
  }
  return;
}

Assistant:

void AdvanceArrayIndex_SnapArrayInfoCompare(uint32* index, uint32* pos, const SnapArrayInfoBlock<T>** segment)
        {
            *index = *index + 1;
            if(*index >= (*segment)->LastIndex)
            {
                *segment = (*segment)->Next;
                *pos = 0;

                if(*segment != nullptr)
                {
                    *index = (*segment)->FirstIndex;
                }
            }
            else
            {
                TTDAssert(*index >= (*segment)->FirstIndex, "Something went wrong.");

                *pos = *index - (*segment)->FirstIndex;
            }
        }